

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O2

int Mio_ParseCheckFormula(Mio_Gate_t *pGate,char *pForm)

{
  byte bVar1;
  int iVar2;
  Mio_Pin_t *pMVar3;
  char *pcVar4;
  ulong uVar5;
  int *piVar6;
  byte *local_b0;
  int fVisit [32];
  
  fVisit[0x1c] = 0;
  fVisit[0x1d] = 0;
  fVisit[0x1e] = 0;
  fVisit[0x1f] = 0;
  fVisit[0x18] = 0;
  fVisit[0x19] = 0;
  fVisit[0x1a] = 0;
  fVisit[0x1b] = 0;
  fVisit[0x14] = 0;
  fVisit[0x15] = 0;
  fVisit[0x16] = 0;
  fVisit[0x17] = 0;
  fVisit[0x10] = 0;
  fVisit[0x11] = 0;
  fVisit[0x12] = 0;
  fVisit[0x13] = 0;
  fVisit[0xc] = 0;
  fVisit[0xd] = 0;
  fVisit[0xe] = 0;
  fVisit[0xf] = 0;
  fVisit[8] = 0;
  fVisit[9] = 0;
  fVisit[10] = 0;
  fVisit[0xb] = 0;
  fVisit[4] = 0;
  fVisit[5] = 0;
  fVisit[6] = 0;
  fVisit[7] = 0;
  fVisit[0] = 0;
  fVisit[1] = 0;
  fVisit[2] = 0;
  fVisit[3] = 0;
  pMVar3 = Mio_GateReadPins(pGate);
  if (pMVar3 != (Mio_Pin_t *)0x0) {
    pMVar3 = Mio_GateReadPins(pGate);
    pcVar4 = Mio_PinReadName(pMVar3);
    if ((*pcVar4 != '*') || (pcVar4[1] != '\0')) {
      local_b0 = (byte *)pForm;
      do {
        bVar1 = *local_b0;
        uVar5 = (ulong)bVar1;
        if (uVar5 < 0x32) {
          if ((0x30fc300000000U >> (uVar5 & 0x3f) & 1) == 0) {
            if (uVar5 == 0) {
              pMVar3 = Mio_GateReadPins(pGate);
              piVar6 = fVisit;
              while( true ) {
                if (pMVar3 == (Mio_Pin_t *)0x0) {
                  return 1;
                }
                if (*piVar6 == 0) break;
                pMVar3 = Mio_PinReadNext(pMVar3);
                piVar6 = piVar6 + 1;
              }
              return 0;
            }
            goto LAB_006eecd9;
          }
        }
        else {
LAB_006eecd9:
          if ((bVar1 != 0x5e) && (bVar1 != 0x7c)) {
            iVar2 = Mio_ParseCheckName(pGate,(char **)&local_b0);
            if (iVar2 == -1) {
              printf("Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n"
                     ,pGate->pName,local_b0);
              return 0;
            }
            if (0x1f < iVar2) {
              __assert_fail("iPin < 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioParse.c"
                            ,0x1e5,"int Mio_ParseCheckFormula(Mio_Gate_t *, char *)");
            }
            fVisit[iVar2] = 1;
          }
        }
        local_b0 = local_b0 + 1;
      } while( true );
    }
  }
  return 1;
}

Assistant:

int Mio_ParseCheckFormula( Mio_Gate_t * pGate, char * pForm )
{
    Mio_Pin_t * pPin;
    char * pStr;
    int i, iPin, fVisit[32] = {0};
    if ( Mio_GateReadPins(pGate) == NULL || !strcmp(Mio_PinReadName(Mio_GateReadPins(pGate)), "*") )
        return 1;
/*
    // find the equality sign
    pForm = strstr( pForm, "=" );
    if ( pForm == NULL )
    {
        printf( "Skipping gate \"%s\" because formula \"%s\" has not equality sign (=).\n", pGate->pName, pForm );
        return 0;
    }
*/
//printf( "Checking gate %s\n", pGate->pName );

    for ( pStr = pForm; *pStr; pStr++ )
    {
        if ( *pStr == ' ' ||
             *pStr == MIO_EQN_SYM_OPEN ||   
             *pStr == MIO_EQN_SYM_CLOSE ||  
             *pStr == MIO_EQN_SYM_CONST0 || 
             *pStr == MIO_EQN_SYM_CONST1 || 
             *pStr == MIO_EQN_SYM_NEG ||    
             *pStr == MIO_EQN_SYM_NEGAFT || 
             *pStr == MIO_EQN_SYM_AND ||    
             *pStr == MIO_EQN_SYM_AND2 ||   
             *pStr == MIO_EQN_SYM_XOR ||    
             *pStr == MIO_EQN_SYM_OR ||     
             *pStr == MIO_EQN_SYM_OR2 
           )
           continue;
        // return the number of the pin which has this name
        iPin = Mio_ParseCheckName( pGate, &pStr );
        if ( iPin == -1 )
        {
            printf( "Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n", pGate->pName, pStr );
            return 0;
        }
        assert( iPin < 32 );
        fVisit[iPin] = 1;
    }
    // check that all pins are used
    for ( pPin = Mio_GateReadPins(pGate), i = 0; pPin; pPin = Mio_PinReadNext(pPin), i++ )
        if ( fVisit[i] == 0 )
        {
//            printf( "Skipping gate \"%s\" because pin \"%s\" does not appear in the formula \"%s\".\n", pGate->pName, Mio_PinReadName(pPin), pForm );
            return 0;
        }
    return 1;
}